

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QPointer<QWidget> __thiscall
QHash<QGesture_*,_QPointer<QWidget>_>::value
          (QHash<QGesture_*,_QPointer<QWidget>_> *this,QGesture **key)

{
  Data *pDVar1;
  QPointer<QWidget> *pQVar2;
  QGesture **in_RDX;
  QObject *extraout_RDX;
  QPointer<QWidget> QVar3;
  
  pQVar2 = QHash<QGesture*,QPointer<QWidget>>::valueImpl<QGesture*>
                     ((QHash<QGesture*,QPointer<QWidget>> *)key,in_RDX);
  if (pQVar2 == (QPointer<QWidget> *)0x0) {
    this->d = (Data *)0x0;
    this[1].d = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)(pQVar2->wp).d;
    this->d = pDVar1;
    this[1].d = (Data *)(pQVar2->wp).value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar3.wp.value = extraout_RDX;
  QVar3.wp.d = (Data *)this;
  return (QPointer<QWidget>)QVar3.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }